

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O0

void re2::CoalesceWalker::DoCoalesce(Regexp **r1ptr,Regexp **r2ptr)

{
  RegexpOp RVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ParseFlags flags;
  ostream *poVar5;
  void *pvVar6;
  Regexp **ppRVar7;
  Rune *pRVar8;
  Regexp *pRVar9;
  LogMessage *pLVar10;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int n;
  Rune r;
  Regexp *nre;
  Regexp *r2;
  Regexp *r1;
  ParseFlags in_stack_fffffffffffffc48;
  RegexpOp in_stack_fffffffffffffc4c;
  Regexp *in_stack_fffffffffffffc50;
  LogMessage *in_stack_fffffffffffffc60;
  int in_stack_fffffffffffffc74;
  int in_stack_fffffffffffffc78;
  ParseFlags in_stack_fffffffffffffc7c;
  Regexp *in_stack_fffffffffffffc80;
  Regexp *in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  Regexp *in_stack_fffffffffffffca0;
  LogMessage local_340;
  int local_1bc;
  Rune local_1b8;
  LogMessage local_1a8;
  Regexp *local_28;
  Regexp *local_20;
  Regexp *local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  local_18 = (Regexp *)*in_RDI;
  local_20 = (Regexp *)*in_RSI;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Regexp::sub(local_18);
  Regexp::Incref(in_stack_fffffffffffffc88);
  Regexp::parse_flags(local_18);
  local_28 = Regexp::Repeat(in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,
                            in_stack_fffffffffffffc78,in_stack_fffffffffffffc74);
  iVar3 = (int)((ulong)in_stack_fffffffffffffc80 >> 0x20);
  RVar1 = Regexp::op(local_18);
  switch(RVar1) {
  case kRegexpStar:
    (local_28->field_7).field_0.min_ = 0;
    (local_28->field_7).field_0.max_ = -1;
    break;
  case kRegexpPlus:
    (local_28->field_7).field_0.min_ = 1;
    (local_28->field_7).field_0.max_ = -1;
    break;
  case kRegexpQuest:
    (local_28->field_7).field_0.min_ = 0;
    (local_28->field_7).field_0.max_ = 1;
    break;
  case kRegexpRepeat:
    iVar2 = Regexp::min(local_18);
    (local_28->field_7).field_0.min_ = iVar2;
    iVar2 = Regexp::max(local_18);
    (local_28->field_7).field_0.max_ = iVar2;
    break;
  default:
    pLVar10 = &local_1a8;
    LogMessage::LogMessage
              ((LogMessage *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               (char *)in_stack_fffffffffffffc88,iVar3);
    poVar5 = LogMessage::stream(pLVar10);
    poVar5 = std::operator<<(poVar5,"DoCoalesce failed: r1->op() is ");
    RVar1 = Regexp::op(local_18);
    std::ostream::operator<<(poVar5,RVar1);
    LogMessage::~LogMessage(in_stack_fffffffffffffc60);
    Regexp::Decref((Regexp *)pLVar10);
    return;
  }
  RVar1 = Regexp::op(local_20);
  switch((char *)(ulong)(RVar1 - kRegexpLiteral)) {
  case (char *)0x0:
  case (char *)0x9:
  case (char *)0xa:
  case (char *)0x11:
    (local_28->field_7).field_0.min_ = (local_28->field_7).field_0.min_ + 1;
    iVar3 = Regexp::max(local_28);
    if (iVar3 != -1) {
      (local_28->field_7).field_0.max_ = (local_28->field_7).field_0.max_ + 1;
    }
    break;
  case (char *)0x1:
    ppRVar7 = Regexp::sub(local_18);
    local_1b8 = Regexp::rune(*ppRVar7);
    local_1bc = 1;
    while( true ) {
      iVar3 = local_1bc;
      iVar2 = Regexp::nrunes(local_20);
      in_stack_fffffffffffffc7c = in_stack_fffffffffffffc7c & 0xffffff;
      if (iVar3 < iVar2) {
        pRVar8 = Regexp::runes(local_20);
        in_stack_fffffffffffffc7c =
             CONCAT13(pRVar8[local_1bc] == local_1b8,(int3)in_stack_fffffffffffffc7c);
      }
      if ((char)(in_stack_fffffffffffffc7c >> 0x18) == '\0') break;
      local_1bc = local_1bc + 1;
    }
    (local_28->field_7).field_0.min_ = local_1bc + (local_28->field_7).field_0.min_;
    iVar2 = Regexp::max(local_28);
    if (iVar2 != -1) {
      (local_28->field_7).field_0.max_ = local_1bc + (local_28->field_7).field_0.max_;
    }
    iVar2 = local_1bc;
    iVar4 = Regexp::nrunes(local_20);
    if (iVar2 != iVar4) {
      *local_8 = local_28;
      Regexp::runes(local_20);
      iVar4 = Regexp::nrunes(local_20);
      flags = iVar4 - local_1bc;
      Regexp::parse_flags(local_20);
      pRVar9 = Regexp::LiteralString((Rune *)CONCAT44(in_stack_fffffffffffffc7c,iVar3),iVar2,flags);
      *local_10 = pRVar9;
      goto LAB_0026aa30;
    }
    break;
  default:
    LogMessage::LogMessage
              ((LogMessage *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               (char *)(ulong)(RVar1 - kRegexpLiteral),iVar3);
    pLVar10 = (LogMessage *)LogMessage::stream(&local_340);
    poVar5 = std::operator<<((ostream *)pLVar10,"DoCoalesce failed: r2->op() is ");
    RVar1 = Regexp::op(local_20);
    std::ostream::operator<<(poVar5,RVar1);
    LogMessage::~LogMessage(pLVar10);
    Regexp::Decref(in_stack_fffffffffffffca0);
    return;
  case (char *)0x4:
    (local_28->field_7).field_0.max_ = -1;
    break;
  case (char *)0x5:
    (local_28->field_7).field_0.min_ = (local_28->field_7).field_0.min_ + 1;
    (local_28->field_7).field_0.max_ = -1;
    break;
  case (char *)0x6:
    iVar3 = Regexp::max(local_28);
    if (iVar3 != -1) {
      (local_28->field_7).field_0.max_ = (local_28->field_7).field_0.max_ + 1;
    }
    break;
  case (char *)0x7:
    iVar3 = Regexp::min(local_20);
    (local_28->field_7).field_0.min_ = iVar3 + (local_28->field_7).field_0.min_;
    iVar3 = Regexp::max(local_20);
    if (iVar3 == -1) {
      (local_28->field_7).field_0.max_ = -1;
    }
    else {
      iVar3 = Regexp::max(local_28);
      if (iVar3 != -1) {
        iVar3 = Regexp::max(local_20);
        (local_28->field_7).field_0.max_ = iVar3 + (local_28->field_7).field_0.max_;
      }
    }
  }
  pvVar6 = operator_new(0x28);
  Regexp::Regexp(in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48);
  *local_8 = pvVar6;
  *local_10 = local_28;
LAB_0026aa30:
  Regexp::Decref(in_stack_fffffffffffffca0);
  Regexp::Decref(in_stack_fffffffffffffca0);
  return;
}

Assistant:

void CoalesceWalker::DoCoalesce(Regexp** r1ptr, Regexp** r2ptr) {
  Regexp* r1 = *r1ptr;
  Regexp* r2 = *r2ptr;

  Regexp* nre = Regexp::Repeat(
      r1->sub()[0]->Incref(), r1->parse_flags(), 0, 0);

  switch (r1->op()) {
    case kRegexpStar:
      nre->min_ = 0;
      nre->max_ = -1;
      break;

    case kRegexpPlus:
      nre->min_ = 1;
      nre->max_ = -1;
      break;

    case kRegexpQuest:
      nre->min_ = 0;
      nre->max_ = 1;
      break;

    case kRegexpRepeat:
      nre->min_ = r1->min();
      nre->max_ = r1->max();
      break;

    default:
      LOG(DFATAL) << "DoCoalesce failed: r1->op() is " << r1->op();
      nre->Decref();
      return;
  }

  switch (r2->op()) {
    case kRegexpStar:
      nre->max_ = -1;
      goto LeaveEmpty;

    case kRegexpPlus:
      nre->min_++;
      nre->max_ = -1;
      goto LeaveEmpty;

    case kRegexpQuest:
      if (nre->max() != -1)
        nre->max_++;
      goto LeaveEmpty;

    case kRegexpRepeat:
      nre->min_ += r2->min();
      if (r2->max() == -1)
        nre->max_ = -1;
      else if (nre->max() != -1)
        nre->max_ += r2->max();
      goto LeaveEmpty;

    case kRegexpLiteral:
    case kRegexpCharClass:
    case kRegexpAnyChar:
    case kRegexpAnyByte:
      nre->min_++;
      if (nre->max() != -1)
        nre->max_++;
      goto LeaveEmpty;

    LeaveEmpty:
      *r1ptr = new Regexp(kRegexpEmptyMatch, Regexp::NoParseFlags);
      *r2ptr = nre;
      break;

    case kRegexpLiteralString: {
      Rune r = r1->sub()[0]->rune();
      // Determine how much of the literal string is removed.
      // We know that we have at least one rune. :)
      int n = 1;
      while (n < r2->nrunes() && r2->runes()[n] == r)
        n++;
      nre->min_ += n;
      if (nre->max() != -1)
        nre->max_ += n;
      if (n == r2->nrunes())
        goto LeaveEmpty;
      *r1ptr = nre;
      *r2ptr = Regexp::LiteralString(
          &r2->runes()[n], r2->nrunes() - n, r2->parse_flags());
      break;
    }

    default:
      LOG(DFATAL) << "DoCoalesce failed: r2->op() is " << r2->op();
      nre->Decref();
      return;
  }

  r1->Decref();
  r2->Decref();
}